

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmTrapcc<(moira::Instr)167,(moira::Mode)12,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  Syntax SVar1;
  uint in_EAX;
  Imu<4> im;
  StrWriter *pSVar2;
  u32 ext;
  undefined8 uStack_28;
  
  SVar1 = str->style->syntax;
  uStack_28._0_4_ = in_EAX;
  im.raw = dasmIncRead<2>(this,addr);
  pSVar2 = StrWriter::operator<<(str);
  if ((SVar1 & ~MOIRA_MIT) == GNU) {
    pSVar2 = StrWriter::operator<<(pSVar2);
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar2,(Ims<2>)im.raw);
  }
  else {
    StrWriter::operator<<(pSVar2,(Tab)(str->tab).raw);
    StrWriter::operator<<(pSVar2,im);
  }
  uStack_28 = (ulong)(uint)uStack_28;
  StrWriter::operator<<(str,(Av<(moira::Instr)167,_(moira::Mode)12,_2> *)((long)&uStack_28 + 4));
  return;
}

Assistant:

void
Moira::dasmTrapcc(StrWriter &str, u32 &addr, u16 op) const
{
    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            switch (S) {

                case Byte:

                    str << Ins<I>{};
                    break;

                case Word:
                case Long:

                    auto ext = dasmIncRead<S>(addr);
                    str << Ins<I>{} << Sz<S>{} << str.tab << Ims<S>(ext);
                    break;
            }
            break;

        default:

            switch (S) {

                case Byte:

                    str << Ins<I>{} << str.tab;
                    break;

                case Word:
                case Long:

                    auto ext = dasmIncRead<S>(addr);
                    str << Ins<I>{} << str.tab << Imu(ext);
                    break;
            }
    }

    str << Av<I, M, S>{};
}